

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

int Gia_ManToBridgeResult(FILE *pFile,int Result,Abc_Cex_t *pCex,int iPoProved)

{
  if (Result == -1) {
    Gia_ManFromBridgeUnknown(pFile,iPoProved);
  }
  else if (Result == 1) {
    Gia_ManFromBridgeHolds(pFile,iPoProved);
  }
  else {
    if (Result != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                    ,0x127,"int Gia_ManToBridgeResult(FILE *, int, Abc_Cex_t *, int)");
    }
    Gia_ManFromBridgeCex(pFile,pCex);
  }
  return 1;
}

Assistant:

int Gia_ManToBridgeResult( FILE * pFile, int Result, Abc_Cex_t * pCex, int iPoProved )
{
    if ( Result == 0 ) // sat
        Gia_ManFromBridgeCex( pFile, pCex );
    else if ( Result == 1 ) // unsat
        Gia_ManFromBridgeHolds( pFile, iPoProved );
    else if ( Result == -1 ) // undef
        Gia_ManFromBridgeUnknown( pFile, iPoProved );
    else assert( 0 );
    return 1;
}